

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.cpp
# Opt level: O3

GLuint __thiscall Texture::loadNormalTexture(Texture *this,char *location)

{
  uchar *img_data;
  GLuint local_34;
  int local_30;
  GLuint texture;
  int width;
  int height;
  
  glGenTextures(1,&local_34);
  glBindTexture(0xde1,local_34);
  img_data = SOIL_load_image(location,&local_30,(int *)&texture,(int *)0x0,3);
  glTexImage2D(0xde1,0,0x1907,local_30,texture,0,0x1907,0x1401,img_data);
  (*__glewGenerateMipmap)(0xde1);
  SOIL_free_image_data(img_data);
  glBindTexture(0xde1,0);
  glTexParameteri(0xde1,0x2802,0x2901);
  glTexParameteri(0xde1,0x2803,0x2901);
  glTexParameteri(0xde1,0x2801,0x2601);
  glTexParameteri(0xde1,0x2800,0x2601);
  return local_34;
}

Assistant:

GLuint Texture::loadNormalTexture(const char* location) {
	// bind texture
	GLuint texture;
	glGenTextures(1, &texture);
	glBindTexture(GL_TEXTURE_2D, texture); 

	// load texture
	int width, height;
	unsigned char* image = SOIL_load_image(location, &width, &height, 0, SOIL_LOAD_RGB);
	glTexImage2D(GL_TEXTURE_2D, 0, GL_RGB, width, height, 0, GL_RGB, GL_UNSIGNED_BYTE, image);
	glGenerateMipmap(GL_TEXTURE_2D);
	SOIL_free_image_data(image);
	glBindTexture(GL_TEXTURE_2D, 0);

	// set parameters
	glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_REPEAT);
	glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_REPEAT);

	glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
	glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);

	// returne texture					 
	return texture;
}